

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void sched_append(NTRUEncodeSchedule *sched,uint16_t op)

{
  size_t sVar1;
  uint32_t *puVar2;
  uint16_t op_local;
  NTRUEncodeSchedule *sched_local;
  
  puVar2 = (uint32_t *)safegrowarray(sched->ops,&sched->opsize,4,sched->nops,1,false);
  sched->ops = puVar2;
  sVar1 = sched->nops;
  sched->nops = sVar1 + 1;
  sched->ops[sVar1] = (uint)op;
  if (op != 1) {
    sched->endpos = (sched->endpos + 1) % sched->nvals;
  }
  return;
}

Assistant:

static inline void sched_append(NTRUEncodeSchedule *sched, uint16_t op)
{
    /* Helper function to append an operation to the schedule, and
     * update endpos. */
    sgrowarray(sched->ops, sched->opsize, sched->nops);
    sched->ops[sched->nops++] = op;
    if (op != ENC_BYTE)
        sched->endpos = (sched->endpos + 1) % sched->nvals;
}